

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O3

void __thiscall
MenuBar::bindSlot(MenuBar *this,ActionMenu actionMenu,function<void_()> *slot,
                 QMainWindow *mainWindow,QString *text)

{
  code *pcVar1;
  undefined8 uVar2;
  QMainWindow *pQVar3;
  undefined4 *puVar4;
  _Base_ptr *pp_Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>,_bool> pVar6;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  QObject local_48 [12];
  ActionMenu actionMenu_local;
  code *local_38;
  undefined8 local_30;
  QMainWindow *mainWindow_local;
  
  actionMenu_local = actionMenu;
  mainWindow_local = mainWindow;
  pVar6 = std::
          _Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
          ::_M_emplace_unique<ActionMenu&,QMainWindow*&>
                    ((_Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
                      *)this,&actionMenu_local,&mainWindow_local);
  pp_Var5 = &pVar6.first._M_node._M_node[1]._M_parent;
  QAction::setText((QString *)pp_Var5);
  pQVar3 = mainWindow_local;
  std::function<void_()>::function((function<void_()> *)&local_68,slot);
  local_38 = QAction::triggered;
  local_30 = 0;
  puVar4 = (undefined4 *)operator_new(0x30);
  uVar2 = uStack_50;
  pcVar1 = local_58;
  if (local_58 == (code *)0x0) {
    *(undefined8 *)(puVar4 + 4) = 0;
    *(undefined8 *)(puVar4 + 6) = 0;
    *(undefined8 *)(puVar4 + 8) = 0;
  }
  else {
    local_58 = (code *)0x0;
    uStack_50 = 0;
    *(void **)(puVar4 + 4) = local_68._M_unused._M_object;
    *(undefined8 *)(puVar4 + 6) = local_68._8_8_;
    *(code **)(puVar4 + 8) = pcVar1;
  }
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar4 + 10) = uVar2;
  QObject::connectImpl
            (local_48,pp_Var5,(QObject *)&local_38,(void **)pQVar3,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void MenuBar::bindSlot( ActionMenu actionMenu, std::function<void( void )> slot, QMainWindow* mainWindow, const QString& text )
{
    auto [it, _] = mapAction.emplace( actionMenu, mainWindow );
    it->second.setText( text );
    QObject::connect( &it->second, &QAction::triggered, mainWindow, slot );
}